

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

sz_sock sznet::net::sockets::sz_accept(sz_sock sockfd,sockaddr_in6 *addr)

{
  int sockfd_00;
  SourceFile file;
  Logger local_fe8;
  socklen_t local_14 [2];
  socklen_t addrlen;
  
  local_14[0] = 0x1c;
  sockfd_00 = accept(sockfd,(sockaddr *)addr,local_14);
  if (sockfd_00 < 0) {
    file._8_8_ = 0xe;
    file.m_data = "SocketsOps.cpp";
    Logger::Logger(&local_fe8,file,0x114,FATAL);
    if (0x12 < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,"sockets::sz_accept",0x12);
      local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x12;
    }
    Logger::~Logger(&local_fe8);
  }
  else {
    sz_setnonblockandcloseonexec(sockfd_00);
  }
  return sockfd_00;
}

Assistant:

sz_sock sz_accept(sz_sock sockfd, struct sockaddr_in6* addr)
{
	socklen_t addrlen = static_cast<socklen_t>(sizeof *addr);
	sz_sock connfd = ::accept(sockfd, sz_sockaddr_cast(addr), &addrlen);
	if (connfd < 0)
	{
		LOG_FATAL << "sockets::sz_accept";
	}
	else
	{
		sz_setnonblockandcloseonexec(connfd);
	}

	return connfd;
}